

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImVec2 *pIVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *outer_window;
  ImGuiTable *pIVar5;
  ImGuiTableTempData *pIVar6;
  ImGuiWindow *pIVar7;
  ImGuiTableColumn *pIVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  ImU32 IVar14;
  ImGuiTable *table;
  ImRect *pIVar15;
  long lVar16;
  long lVar17;
  ImGuiTableColumn *pIVar18;
  undefined1 *puVar19;
  ImGuiTableTempData *pIVar20;
  undefined1 *puVar21;
  ulong uVar22;
  int iVar23;
  ImGuiContext *g;
  void *pvVar24;
  ulong uVar25;
  byte bVar26;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  ImRect IVar31;
  void *local_100;
  ImRect outer_rect;
  ImGuiTableTempData local_a8;
  
  pIVar10 = GImGui;
  bVar26 = 0;
  GImGui->CurrentWindow->WriteAccessed = true;
  outer_window = pIVar10->CurrentWindow;
  if (outer_window->SkipItems != false) {
    return false;
  }
  IVar9 = GetContentRegionAvail();
  fVar28 = IVar9.y;
  auVar27._8_4_ = extraout_XMM0_Dc;
  auVar27._0_4_ = IVar9.x;
  auVar27._4_4_ = IVar9.y;
  auVar27._12_4_ = extraout_XMM0_Dd;
  if (IVar9.x <= 1.0) {
    auVar27._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar9 = CalcItemSize(*outer_size,auVar27._0_4_,0.0);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar9.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar9.x + outer_rect.Min.x;
  }
  else {
    if (fVar28 <= 1.0) {
      fVar28 = 1.0;
    }
    IVar9 = CalcItemSize(*outer_size,auVar27._0_4_,fVar28);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar9.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar9.x + outer_rect.Min.x;
    bVar11 = IsClippedEx(&outer_rect,0);
    if (bVar11) {
      ItemSize(&outer_rect,-1.0);
      return false;
    }
  }
  table = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar10->Tables,id);
  iVar23 = 0;
  if (table->LastFrameActive == pIVar10->FrameCount) {
    iVar23 = table->InstanceCurrent + 1;
  }
  uVar3 = table->Flags;
  pIVar5 = (pIVar10->Tables).Buf.Data;
  iVar4 = pIVar10->TablesTempDataStacked;
  iVar12 = iVar4 + 1;
  pIVar10->TablesTempDataStacked = iVar12;
  if ((pIVar10->TablesTempData).Size <= iVar4) {
    local_a8.UserOuterSize.x = 0.0;
    local_a8.UserOuterSize.y = 0.0;
    local_a8.HostBackupColumnsOffset.x = 0.0;
    local_a8.HostBackupItemWidth = 0.0;
    local_a8.HostBackupItemWidthStackSize = 0;
    local_a8._108_4_ = 0;
    local_a8.HostBackupCurrLineSize.x = 0.0;
    local_a8.HostBackupCurrLineSize.y = 0.0;
    local_a8.HostBackupCursorMaxPos.x = 0.0;
    local_a8.HostBackupCursorMaxPos.y = 0.0;
    local_a8.HostBackupParentWorkRect.Max.x = 0.0;
    local_a8.HostBackupParentWorkRect.Max.y = 0.0;
    local_a8.HostBackupPrevLineSize.x = 0.0;
    local_a8.HostBackupPrevLineSize.y = 0.0;
    local_a8.HostBackupWorkRect.Max.x = 0.0;
    local_a8.HostBackupWorkRect.Max.y = 0.0;
    local_a8.HostBackupParentWorkRect.Min.x = 0.0;
    local_a8.HostBackupParentWorkRect.Min.y = 0.0;
    local_a8.DrawSplitter._Channels.Data = (ImDrawChannel *)0x0;
    local_a8.HostBackupWorkRect.Min.x = 0.0;
    local_a8.HostBackupWorkRect.Min.y = 0.0;
    local_a8.DrawSplitter._Current = 0;
    local_a8.DrawSplitter._Count = 0;
    local_a8.DrawSplitter._Channels.Size = 0;
    local_a8.DrawSplitter._Channels.Capacity = 0;
    local_a8.TableIndex = 0;
    local_a8.LastTimeActive = -1.0;
    ImVector<ImGuiTableTempData>::resize(&pIVar10->TablesTempData,iVar12,&local_a8);
    ImDrawListSplitter::~ImDrawListSplitter(&local_a8.DrawSplitter);
    iVar12 = pIVar10->TablesTempDataStacked;
  }
  pIVar20 = (pIVar10->TablesTempData).Data;
  lVar16 = (long)iVar12;
  table->TempData = pIVar20 + lVar16 + -1;
  iVar12 = (int)(((long)table - (long)pIVar5) / 0x218);
  pIVar20[lVar16 + -1].TableIndex = iVar12;
  pIVar6 = table->TempData;
  table->DrawSplitter = &pIVar6->DrawSplitter;
  (pIVar6->DrawSplitter)._Current = 0;
  (pIVar6->DrawSplitter)._Count = 1;
  table->IsDefaultSizingPolicy = (flags & 0xe000U) == 0;
  uVar13 = TableFixFlags(flags,outer_window);
  table->ID = id;
  table->Flags = uVar13;
  table->InstanceCurrent = (ImS16)iVar23;
  table->LastFrameActive = pIVar10->FrameCount;
  table->InnerWindow = outer_window;
  table->OuterWindow = outer_window;
  table->ColumnsCount = columns_count;
  table->IsLayoutLocked = false;
  table->InnerWidth = inner_width;
  pIVar20[lVar16 + -1].UserOuterSize = *outer_size;
  if ((0 < iVar23) && ((table->InstanceDataExtra).Size < iVar23)) {
    local_a8.TableIndex = 0;
    local_a8.LastTimeActive = 0.0;
    ImVector<ImGuiTableInstanceData>::push_back
              (&table->InstanceDataExtra,(ImGuiTableInstanceData *)&local_a8);
  }
  if ((flags & 0x3000000U) == 0) {
    pIVar15 = &outer_rect;
    (table->InnerRect).Min = outer_rect.Min;
    (table->InnerRect).Max = outer_rect.Max;
    (table->OuterRect).Min = outer_rect.Min;
    (table->OuterRect).Max = outer_rect.Max;
    lVar17 = 0x110;
  }
  else {
    fVar28 = inner_width;
    if ((uVar13 & 0x1000000) == 0) {
      fVar28 = 3.4028235e+38;
    }
    local_a8.LastTimeActive = 0.0;
    fVar28 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar28 & -(uint)(0.0 < inner_width));
    if ((((uVar13 & 0x3000000) == 0x1000000) || (fVar28 != 3.4028235e+38)) || (NAN(fVar28))) {
      if ((uVar13 & 0x3000000) == 0x1000000) {
        local_a8.LastTimeActive = 1.1754944e-38;
      }
      local_a8.TableIndex = -(uint)(fVar28 != 3.4028235e+38) & (uint)fVar28;
      SetNextWindowContentSize((ImVec2 *)&local_a8);
    }
    if ((uVar3 & 0x3000000) == 0) {
      local_a8.TableIndex = 0;
      local_a8.LastTimeActive = 0.0;
      SetNextWindowScroll((ImVec2 *)&local_a8);
    }
    local_a8.TableIndex = (int)(outer_rect.Max.x - outer_rect.Min.x);
    local_a8.LastTimeActive = outer_rect.Max.y - outer_rect.Min.y;
    BeginChildEx(name,iVar23 + id,(ImVec2 *)&local_a8,false,(uVar13 & 0x1000000) >> 0xd);
    pIVar7 = pIVar10->CurrentWindow;
    table->InnerWindow = pIVar7;
    IVar9 = (pIVar7->WorkRect).Max;
    (table->WorkRect).Min = (pIVar7->WorkRect).Min;
    (table->WorkRect).Max = IVar9;
    IVar31 = ImGuiWindow::Rect(pIVar7);
    table->OuterRect = IVar31;
    pIVar15 = &table->InnerWindow->InnerRect;
    lVar17 = 0x100;
  }
  IVar9 = pIVar15->Max;
  pIVar1 = (ImVec2 *)((long)&table->ID + lVar17);
  *pIVar1 = pIVar15->Min;
  pIVar1[1] = IVar9;
  PushOverrideID(iVar23 + id);
  pIVar7 = table->InnerWindow;
  table->HostIndentX = (pIVar7->DC).Indent.x;
  IVar9 = (pIVar7->ClipRect).Max;
  (table->HostClipRect).Min = (pIVar7->ClipRect).Min;
  (table->HostClipRect).Max = IVar9;
  table->HostSkipItems = pIVar7->SkipItems;
  IVar9 = (pIVar7->WorkRect).Max;
  pIVar20[lVar16 + -1].HostBackupWorkRect.Min = (pIVar7->WorkRect).Min;
  pIVar20[lVar16 + -1].HostBackupWorkRect.Max = IVar9;
  IVar9 = (pIVar7->ParentWorkRect).Max;
  pIVar20[lVar16 + -1].HostBackupParentWorkRect.Min = (pIVar7->ParentWorkRect).Min;
  pIVar20[lVar16 + -1].HostBackupParentWorkRect.Max = IVar9;
  pIVar20[lVar16 + -1].HostBackupColumnsOffset.x = (outer_window->DC).ColumnsOffset.x;
  pIVar20[lVar16 + -1].HostBackupPrevLineSize = (pIVar7->DC).PrevLineSize;
  pIVar20[lVar16 + -1].HostBackupCurrLineSize = (pIVar7->DC).CurrLineSize;
  pIVar20[lVar16 + -1].HostBackupCursorMaxPos = (pIVar7->DC).CursorMaxPos;
  pIVar20[lVar16 + -1].HostBackupItemWidth = (outer_window->DC).ItemWidth;
  pIVar20[lVar16 + -1].HostBackupItemWidthStackSize = (outer_window->DC).ItemWidthStack.Size;
  fVar28 = 0.0;
  fVar30 = 0.0;
  if ((uVar13 >> 9 & 1) != 0) {
    fVar30 = 1.0;
  }
  (pIVar7->DC).CurrLineSize.x = 0.0;
  (pIVar7->DC).CurrLineSize.y = 0.0;
  (pIVar7->DC).PrevLineSize.x = 0.0;
  (pIVar7->DC).PrevLineSize.y = 0.0;
  if ((uVar13 & 0x800200) == 0x200) {
    fVar28 = (pIVar10->Style).CellPadding.x;
LAB_001ffbca:
    fVar29 = 0.0;
  }
  else {
    if ((uVar13 & 0x800200) != 0) goto LAB_001ffbca;
    fVar29 = (pIVar10->Style).CellPadding.x;
  }
  table->CellSpacingX1 = fVar30 + fVar29;
  table->CellSpacingX2 = fVar29;
  table->CellPaddingX = fVar28;
  table->CellPaddingY = (pIVar10->Style).CellPadding.y;
  fVar30 = 0.0;
  fVar29 = 0.0;
  if ((uVar13 >> 10 & 1) != 0) {
    fVar29 = 1.0;
  }
  if ((uVar13 >> 0x16 & 1) == 0 && (uVar13 & 0x200400) != 0) {
    fVar30 = (pIVar10->Style).CellPadding.x;
  }
  table->OuterPaddingX = (fVar29 + fVar30) - fVar28;
  table->CurrentRow = -1;
  table->CurrentColumn = -1;
  table->RowBgColorCounter = 0;
  pIVar15 = &pIVar7->ClipRect;
  if (pIVar7 == outer_window) {
    pIVar15 = &table->WorkRect;
  }
  *(uint *)&table->field_0x98 = (uint)*(ushort *)&table->field_0x98;
  IVar9 = pIVar15->Max;
  (table->InnerClipRect).Min = pIVar15->Min;
  (table->InnerClipRect).Max = IVar9;
  ImRect::ClipWith(&table->InnerClipRect,&table->WorkRect);
  ImRect::ClipWithFull(&table->InnerClipRect,&table->HostClipRect);
  if ((uVar13 >> 0x11 & 1) == 0) {
    fVar28 = (pIVar7->ClipRect).Max.y;
  }
  else {
    fVar28 = (table->InnerClipRect).Max.y;
    fVar30 = (pIVar7->WorkRect).Max.y;
    if (fVar30 <= fVar28) {
      fVar28 = fVar30;
    }
  }
  (table->InnerClipRect).Max.y = fVar28;
  fVar28 = (table->WorkRect).Min.y;
  table->RowPosY2 = fVar28;
  table->RowPosY1 = fVar28;
  table->RowTextBaseline = 0.0;
  table->FreezeRowsRequest = '\0';
  table->FreezeRowsCount = '\0';
  table->FreezeColumnsRequest = '\0';
  table->FreezeColumnsCount = '\0';
  table->IsUnfrozenRows = true;
  table->DeclColumnsCount = '\0';
  IVar14 = GetColorU32(0x2b,1.0);
  table->BorderColorStrong = IVar14;
  IVar14 = GetColorU32(0x2c,1.0);
  table->BorderColorLight = IVar14;
  pIVar10->CurrentTable = table;
  (outer_window->DC).CurrentTableIdx = iVar12;
  if (pIVar7 != outer_window) {
    (pIVar7->DC).CurrentTableIdx = iVar12;
  }
  if (((uVar3 & 2) != 0) && ((uVar13 & 2) == 0)) {
    table->IsResetDisplayOrderRequest = true;
  }
  if ((pIVar10->TablesLastTimeActive).Size <= iVar12) {
    local_a8.TableIndex = -0x40800000;
    ImVector<float>::resize(&pIVar10->TablesLastTimeActive,iVar12 + 1,(float *)&local_a8);
  }
  (pIVar10->TablesLastTimeActive).Data[iVar12] = (float)pIVar10->Time;
  pIVar20[lVar16 + -1].LastTimeActive = (float)pIVar10->Time;
  table->MemoryCompacted = false;
  pvVar24 = table->RawData;
  pIVar18 = (table->Columns).Data;
  iVar23 = (int)(((long)(table->Columns).DataEnd - (long)pIVar18) / 0x68);
  if (iVar23 == columns_count || iVar23 == 0) {
    pIVar18 = (ImGuiTableColumn *)0x0;
    local_100 = (void *)0x0;
    bVar11 = pvVar24 == (void *)0x0;
    pvVar24 = (void *)0x0;
    if (bVar11) goto LAB_001ffe17;
  }
  else {
    table->RawData = (void *)0x0;
LAB_001ffe17:
    TableBeginInitMemory(table,columns_count);
    table->IsSettingsRequestLoad = true;
    table->IsInitializing = true;
    local_100 = pvVar24;
  }
  if (table->IsResetAllRequest == true) {
    table->IsInitializing = true;
    table->IsResetAllRequest = false;
    table->IsSettingsRequestLoad = false;
    table->IsSettingsDirty = true;
    table->SettingsLoadedFlags = 0;
  }
  else if ((table->IsInitializing & 1U) == 0) goto LAB_001fff71;
  table->SettingsOffset = -1;
  table->IsSortSpecsDirty = true;
  table->InstanceInteracted = -1;
  table->ContextPopupColumn = -1;
  table->ReorderColumn = -1;
  lVar16 = 0;
  uVar22 = 0;
  if (0 < columns_count) {
    uVar22 = (ulong)(uint)columns_count;
  }
  table->LastResizedColumn = -1;
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  table->AutoFitSingleColumn = -1;
  table->ResizedColumn = -1;
  for (uVar25 = 0; uVar22 != uVar25; uVar25 = uVar25 + 1) {
    pIVar8 = (table->Columns).Data;
    puVar21 = (undefined1 *)((long)&pIVar8->Flags + lVar16);
    if ((pIVar18 == (ImGuiTableColumn *)0x0) || ((long)iVar23 <= (long)uVar25)) {
      uVar2 = *(undefined4 *)((long)&pIVar8->WidthAuto + lVar16);
      ImGuiTableColumn::ImGuiTableColumn((ImGuiTableColumn *)&local_a8);
      pIVar20 = &local_a8;
      for (lVar17 = 0x67; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar21 = (char)pIVar20->TableIndex;
        pIVar20 = (ImGuiTableTempData *)((long)pIVar20 + (ulong)bVar26 * -2 + 1);
        puVar21 = puVar21 + (ulong)bVar26 * -2 + 1;
      }
      *(undefined4 *)((long)&pIVar8->WidthAuto + lVar16) = uVar2;
      (&pIVar8->IsPreserveWidthAuto)[lVar16] = true;
      (&pIVar8->IsUserEnabledNextFrame)[lVar16] = true;
      *(undefined2 *)(&pIVar8->IsEnabled + lVar16) = 0x101;
    }
    else {
      puVar19 = (undefined1 *)((long)&pIVar18->Flags + lVar16);
      for (lVar17 = 0x67; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar21 = *puVar19;
        puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
        puVar21 = puVar21 + (ulong)bVar26 * -2 + 1;
      }
    }
    (table->DisplayOrderToIndex).Data[uVar25] = (ImGuiTableColumnIdx)uVar25;
    (&pIVar8->DisplayOrder)[lVar16] = (ImGuiTableColumnIdx)uVar25;
    lVar16 = lVar16 + 0x68;
  }
LAB_001fff71:
  if (local_100 != (void *)0x0) {
    MemFree(local_100);
  }
  if (table->IsSettingsRequestLoad == true) {
    TableLoadSettings(table);
  }
  fVar28 = pIVar10->FontSize;
  fVar30 = table->RefScale;
  if ((fVar30 != 0.0) || (NAN(fVar30))) {
    if ((fVar30 != fVar28) || (NAN(fVar30) || NAN(fVar28))) {
      uVar25 = 0;
      uVar22 = (ulong)(uint)columns_count;
      if (columns_count < 1) {
        uVar22 = uVar25;
      }
      for (; uVar22 * 0x68 - uVar25 != 0; uVar25 = uVar25 + 0x68) {
        pIVar18 = (table->Columns).Data;
        *(float *)((long)&pIVar18->WidthRequest + uVar25) =
             *(float *)((long)&pIVar18->WidthRequest + uVar25) * (fVar28 / fVar30);
      }
    }
  }
  table->RefScale = fVar28;
  pIVar7->SkipItems = true;
  if (0 < (table->ColumnsNames).Buf.Size) {
    ImVector<char>::resize(&(table->ColumnsNames).Buf,0);
  }
  TableBeginApplyRequests(table);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;
    if (instance_no > 0 && table->InstanceDataExtra.Size < instance_no)
        table->InstanceDataExtra.push_back(ImGuiTableInstanceData());

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_PRINT("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}